

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_output_auth
                   (Curl_easy *data,connectdata *conn,char *request,Curl_HttpReq httpreq,char *path,
                   _Bool proxytunnel)

{
  auth *authstatus;
  auth *authstatus_00;
  undefined1 *puVar1;
  unsigned_long uVar2;
  _Bool _Var3;
  CURLcode CVar4;
  byte bVar5;
  ConnectBits CVar6;
  
  if ((((~(uint)conn->bits & 5) == 0) || ((data->state).aptr.user != (char *)0x0)) ||
     ((data->set).str[0x40] != (char *)0x0)) {
    authstatus = &(data->state).authhost;
    authstatus_00 = &(data->state).authproxy;
    uVar2 = authstatus->want;
    if ((uVar2 != 0) && ((data->state).authhost.picked == 0)) {
      (data->state).authhost.picked = uVar2;
    }
    uVar2 = authstatus_00->want;
    if ((uVar2 != 0) && ((data->state).authproxy.picked == 0)) {
      (data->state).authproxy.picked = uVar2;
    }
    if ((((uint)conn->bits & 1) == 0) || ((((uint)conn->bits & 8) == 0) == proxytunnel)) {
      puVar1 = &(data->state).authproxy.field_0x18;
      *puVar1 = *puVar1 | 1;
    }
    else {
      CVar4 = output_auth_headers(data,conn,authstatus_00,request,path,true);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
    _Var3 = Curl_auth_allowed_to_host(data);
    if ((_Var3) || (((conn->bits).field_0x2 & 0x20) != 0)) {
      CVar4 = output_auth_headers(data,conn,authstatus,request,path,false);
      bVar5 = (data->state).authhost.field_0x18;
    }
    else {
      bVar5 = (data->state).authhost.field_0x18 | 1;
      (data->state).authhost.field_0x18 = bVar5;
      CVar4 = CURLE_OK;
    }
    if (((((bVar5 & 3) == 2) || (((data->state).authproxy.field_0x18 & 3) == 2)) &&
        (httpreq != HTTPREQ_GET)) && (httpreq != HTTPREQ_HEAD)) {
      CVar6 = (ConnectBits)((uint)conn->bits | 0x10000);
    }
    else {
      CVar6 = (ConnectBits)((uint)conn->bits & 0xfffeffff);
    }
    conn->bits = CVar6;
  }
  else {
    puVar1 = &(data->state).authhost.field_0x18;
    *puVar1 = *puVar1 | 1;
    puVar1 = &(data->state).authproxy.field_0x18;
    *puVar1 = *puVar1 | 1;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode
Curl_http_output_auth(struct Curl_easy *data,
                      struct connectdata *conn,
                      const char *request,
                      Curl_HttpReq httpreq,
                      const char *path,
                      bool proxytunnel) /* TRUE if this is the request setting
                                           up the proxy tunnel */
{
  CURLcode result = CURLE_OK;
  struct auth *authhost;
  struct auth *authproxy;

  DEBUGASSERT(data);

  authhost = &data->state.authhost;
  authproxy = &data->state.authproxy;

  if(
#ifndef CURL_DISABLE_PROXY
    (conn->bits.httpproxy && conn->bits.proxy_user_passwd) ||
#endif
     data->state.aptr.user ||
#ifdef USE_SPNEGO
     authhost->want & CURLAUTH_NEGOTIATE ||
     authproxy->want & CURLAUTH_NEGOTIATE ||
#endif
     data->set.str[STRING_BEARER])
    /* continue please */;
  else {
    authhost->done = TRUE;
    authproxy->done = TRUE;
    return CURLE_OK; /* no authentication with no user or password */
  }

  if(authhost->want && !authhost->picked)
    /* The app has selected one or more methods, but none has been picked
       so far by a server round-trip. Then we set the picked one to the
       want one, and if this is one single bit it'll be used instantly. */
    authhost->picked = authhost->want;

  if(authproxy->want && !authproxy->picked)
    /* The app has selected one or more methods, but none has been picked so
       far by a proxy round-trip. Then we set the picked one to the want one,
       and if this is one single bit it'll be used instantly. */
    authproxy->picked = authproxy->want;

#ifndef CURL_DISABLE_PROXY
  /* Send proxy authentication header if needed */
  if(conn->bits.httpproxy &&
     (conn->bits.tunnel_proxy == (bit)proxytunnel)) {
    result = output_auth_headers(data, conn, authproxy, request, path, TRUE);
    if(result)
      return result;
  }
  else
#else
  (void)proxytunnel;
#endif /* CURL_DISABLE_PROXY */
    /* we have no proxy so let's pretend we're done authenticating
       with it */
    authproxy->done = TRUE;

  /* To prevent the user+password to get sent to other than the original host
     due to a location-follow */
  if(Curl_auth_allowed_to_host(data)
#ifndef CURL_DISABLE_NETRC
     || conn->bits.netrc
#endif
    )
    result = output_auth_headers(data, conn, authhost, request, path, FALSE);
  else
    authhost->done = TRUE;

  if(((authhost->multipass && !authhost->done) ||
      (authproxy->multipass && !authproxy->done)) &&
     (httpreq != HTTPREQ_GET) &&
     (httpreq != HTTPREQ_HEAD)) {
    /* Auth is required and we are not authenticated yet. Make a PUT or POST
       with content-length zero as a "probe". */
    conn->bits.authneg = TRUE;
  }
  else
    conn->bits.authneg = FALSE;

  return result;
}